

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

CURLcode Curl_cpool_add(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  Curl_share *pCVar2;
  char *pcVar3;
  hash_function p_Var4;
  curl_trc_feat *pcVar5;
  size_t sVar6;
  Curl_llist *l;
  void *pvVar7;
  CURLcode CVar8;
  Curl_llist_node *__n;
  Curl_multi *pCVar9;
  Curl_hash *h;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_FAILED_INIT;
  }
  pCVar2 = data->share;
  if ((pCVar2 == (Curl_share *)0x0) || ((pCVar2->specifier & 0x20) == 0)) {
    pCVar9 = data->multi_easy;
    if ((pCVar9 == (Curl_multi *)0x0) && (pCVar9 = data->multi, pCVar9 == (Curl_multi *)0x0)) {
      return CURLE_FAILED_INIT;
    }
    h = &(pCVar9->cpool).dest2bundle;
  }
  else {
    h = &(pCVar2->cpool).dest2bundle;
  }
  if ((h[2].table != (Curl_hash_element **)0x0) && (((ulong)*h[2].table & 0x2000000000) != 0)) {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  *(byte *)&h[2].hash_func = *(byte *)&h[2].hash_func | 1;
  pcVar3 = conn->destination;
  sVar6 = strlen(pcVar3);
  l = (Curl_llist *)Curl_hash_pick(h,pcVar3,sVar6 + 1);
  if (l == (Curl_llist *)0x0) {
    pcVar3 = conn->destination;
    sVar6 = strlen(pcVar3);
    l = (Curl_llist *)(*Curl_ccalloc)(1,sVar6 + 0x30);
    CVar8 = CURLE_OUT_OF_MEMORY;
    if (l == (Curl_llist *)0x0) goto LAB_0011a6b0;
    Curl_llist_init(l,(Curl_llist_dtor)0x0);
    __n = (Curl_llist_node *)(sVar6 + 1);
    l[1]._head = __n;
    memcpy(&l[1]._tail,pcVar3,(size_t)__n);
    pvVar7 = Curl_hash_add(h,&l[1]._tail,(size_t)__n,l);
    if (pvVar7 == (void *)0x0) {
      (*Curl_cfree)(l);
      CVar8 = CURLE_OUT_OF_MEMORY;
      goto LAB_0011a6b0;
    }
  }
  Curl_llist_append(l,conn,&conn->cpool_node);
  puVar1 = &(conn->bits).field_0x4;
  *puVar1 = *puVar1 | 1;
  p_Var4 = h[1].hash_func;
  h[1].hash_func = p_Var4 + 1;
  conn->connection_id = (curl_off_t)p_Var4;
  h[1].table = (Curl_hash_element **)((long)h[1].table + 1);
  CVar8 = CURLE_OK;
  if ((((data->set).field_0x89f & 0x40) != 0) &&
     (((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)) &&
      (CVar8 = CURLE_OK, 0 < Curl_trc_feat_multi.log_level)))) {
    CVar8 = CURLE_OK;
    Curl_trc_multi(data,"[CPOOL] added connection %ld. The cache now contains %zu members");
  }
LAB_0011a6b0:
  *(byte *)&h[2].hash_func = *(byte *)&h[2].hash_func & 0xfe;
  if ((h[2].table != (Curl_hash_element **)0x0) && (((ulong)*h[2].table & 0x2000000000) != 0)) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  return CVar8;
}

Assistant:

CURLcode Curl_cpool_add(struct Curl_easy *data,
                        struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct cpool_bundle *bundle = NULL;
  struct cpool *cpool = cpool_get_instance(data);
  DEBUGASSERT(conn);

  DEBUGASSERT(cpool);
  if(!cpool)
    return CURLE_FAILED_INIT;

  CPOOL_LOCK(cpool, data);
  bundle = cpool_find_bundle(cpool, conn);
  if(!bundle) {
    bundle = cpool_add_bundle(cpool, conn);
    if(!bundle) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  cpool_bundle_add(bundle, conn);
  conn->connection_id = cpool->next_connection_id++;
  cpool->num_conn++;
  CURL_TRC_M(data, "[CPOOL] added connection %" FMT_OFF_T ". "
             "The cache now contains %zu members",
             conn->connection_id, cpool->num_conn);
out:
  CPOOL_UNLOCK(cpool, data);

  return result;
}